

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O1

int Extra_bddSuppSize(DdManager *dd,DdNode *bSupp)

{
  DdNode *pDVar1;
  int iVar2;
  
  pDVar1 = dd->one;
  if (pDVar1 == bSupp) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    do {
      if (((ulong)bSupp & 1) != 0) {
        __assert_fail("!Cudd_IsComplement(bSupp)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                      ,0x146,"int Extra_bddSuppSize(DdManager *, DdNode *)");
      }
      if ((bSupp->type).kids.E != (DdNode *)((ulong)pDVar1 ^ 1)) {
        __assert_fail("cuddE(bSupp) == b0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/extrab/extraBddMisc.c"
                      ,0x147,"int Extra_bddSuppSize(DdManager *, DdNode *)");
      }
      bSupp = (bSupp->type).kids.T;
      iVar2 = iVar2 + 1;
    } while (bSupp != pDVar1);
  }
  return iVar2;
}

Assistant:

int Extra_bddSuppSize( DdManager * dd, DdNode * bSupp )
{
    int Counter = 0;
    while ( bSupp != b1 )
    {
        assert( !Cudd_IsComplement(bSupp) );
        assert( cuddE(bSupp) == b0 );

        bSupp = cuddT(bSupp);
        Counter++;
    }
    return Counter;
}